

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpillPointers.cpp
# Opt level: O0

void __thiscall
wasm::SpillPointers::visitSpillable<wasm::CallIndirect>(SpillPointers *this,CallIndirect *curr)

{
  Expression **ppEVar1;
  mapped_type *pppEVar2;
  Expression **local_20;
  Expression **pointer;
  CallIndirect *curr_local;
  SpillPointers *this_local;
  
  if ((this->
      super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
      ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
      super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
      .currBasicBlock != (BasicBlock *)0x0) {
    pointer = (Expression **)curr;
    curr_local = (CallIndirect *)this;
    local_20 = Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::
               getCurrentPointer((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                  *)&(this->
                                     super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                                     ).
                                     super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                );
    std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
    emplace_back<wasm::Expression**&>
              ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
               &(((this->
                  super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                  ).
                  super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                  .
                  super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                 .currBasicBlock)->contents).actions,&local_20);
    ppEVar1 = local_20;
    pppEVar2 = std::
               unordered_map<wasm::Expression_**,_wasm::Expression_**,_std::hash<wasm::Expression_**>,_std::equal_to<wasm::Expression_**>,_std::allocator<std::pair<wasm::Expression_**const,_wasm::Expression_**>_>_>
               ::operator[](&this->actualPointers,&local_20);
    *pppEVar2 = ppEVar1;
  }
  return;
}

Assistant:

void visitSpillable(T* curr) {
    // if in unreachable code, ignore
    if (!currBasicBlock) {
      return;
    }
    auto* pointer = getCurrentPointer();
    currBasicBlock->contents.actions.emplace_back(pointer);
    // starts out as correct, may change later
    actualPointers[pointer] = pointer;
  }